

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t wVar1;
  wchar_t y;
  int iVar2;
  long lVar3;
  wchar_t *buf;
  loc_conflict lVar4;
  ulong uVar5;
  ulong uVar6;
  wchar_t wVar7;
  uint local_88;
  wchar_t ac;
  wchar_t vc;
  wchar_t local_7c;
  wchar_t *local_78;
  wchar_t *local_70;
  wchar_t *local_68;
  ulong local_60;
  ulong local_58;
  ui_entry_combiner_funcs_conflict combiner;
  
  lVar4.y = 0;
  lVar4.x = (details->value_position).x;
  uVar6 = (ulong)(uint)(details->value_position).y;
  local_88 = 7;
  if (details->alternate_color_first == false) {
    local_88 = 0;
  }
  lVar3 = ((long)info->ndigit + 1) - (ulong)(info->sign == L'\0');
  local_7c = nlabel;
  local_78 = label;
  local_70 = auxvals;
  local_68 = vals;
  buf = (wchar_t *)mem_alloc(lVar3 * 4);
  if (((info->ncolors < L'\x0e') || (info->nlabcolors < L'\x06')) || (info->nsym < L'\a')) {
    __assert_fail("info->ncolors >= 14 && info->nlabcolors >= 6 && info->nsym >= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                  ,0x3ec,
                  "void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                 );
  }
  uVar5 = 0;
  local_60 = 0;
  if (L'\0' < n) {
    local_60 = (ulong)(uint)n;
  }
  do {
    if (local_60 == uVar5) {
      mem_free(buf);
      wVar1 = local_7c;
      if ((L'\0' < local_7c) || (details->show_combined == true)) {
        iVar2 = ui_entry_combiner_get_funcs
                          (info->combiner_index,(ui_entry_combiner_funcs *)&combiner);
        if (iVar2 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/ui-entry-renderers.c"
                        ,0x445,
                        "void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                       );
        }
        (*combiner.vec_func)(n,local_68,local_70,&vc,&ac);
        if (L'\0' < wVar1) {
          if (details->known_rune == true) {
            if (((uint)(vc + L'\x80000002') < 2) || (vc == L'\0')) {
              uVar6 = 1;
              if ((1 < (uint)(ac + L'\x80000002')) && (ac != L'\0')) {
                uVar6 = (ulong)(L'\0' < ac) ^ 5;
              }
            }
            else {
              uVar6 = (ulong)(L'\0' < vc) ^ 3;
            }
          }
          else {
            uVar6 = 0;
          }
          wVar7 = (details->label_position).x;
          y = (details->label_position).y;
          if (details->vertical_label == true) {
            for (uVar5 = 0; (uint)wVar1 != uVar5; uVar5 = uVar5 + 1) {
              Term_putch(wVar7,y + (int)uVar5,info->label_colors[uVar6],local_78[uVar5]);
            }
          }
          else {
            safe_queue_chars(wVar7,y,wVar1,info->label_colors[uVar6],local_78);
          }
        }
        if (details->show_combined == true) {
          show_combined_generic(info,details,vc,ac);
        }
      }
      return;
    }
    wVar1 = local_68[uVar5];
    wVar7 = (wchar_t)lVar3;
    local_58 = uVar5;
    if (wVar1 == L'\x7fffffff') {
LAB_001b589b:
      iVar2 = 0;
      format_int(L'\0',false,*info->symbols,*info->symbols,true,info->sign == L'\x01',wVar7,buf);
    }
    else if (wVar1 == L'\x7ffffffe') {
      iVar2 = 1;
      format_int(L'\0',false,info->symbols[1],info->symbols[1],true,info->sign == L'\x01',wVar7,buf)
      ;
    }
    else if (wVar1 == L'\0') {
      wVar1 = local_70[uVar5];
      if (wVar1 == L'\x7fffffff') goto LAB_001b589b;
      if ((uint)(wVar1 + L'\x80000002') < 0x80000003) {
        if (wVar1 < L'\0') {
          format_int(L'\0',false,info->symbols[2],info->symbols[6],false,info->sign != L'\0',wVar7,
                     buf);
          iVar2 = 6;
        }
        else {
          format_int(L'\0',false,info->symbols[2],info->symbols[3],true,info->sign == L'\x01',wVar7,
                     buf);
          iVar2 = 2;
        }
      }
      else {
        format_int(wVar1,false,info->symbols[2],info->symbols[5],true,info->sign == L'\x01',wVar7,
                   buf);
        iVar2 = 5;
      }
    }
    else if (wVar1 < L'\x01') {
      format_int(-wVar1,false,info->symbols[2],info->symbols[4],false,info->sign != L'\0',wVar7,buf)
      ;
      iVar2 = 4;
    }
    else {
      format_int(wVar1,false,info->symbols[2],info->symbols[3],true,info->sign == L'\x01',wVar7,buf)
      ;
      iVar2 = 3;
    }
    safe_queue_chars(lVar4.x,(wchar_t)uVar6,wVar7,info->colors[iVar2 + local_88],buf);
    if (info->units_nlabel != L'\0') {
      safe_queue_chars(lVar4.x + wVar7,(wchar_t)uVar6,info->units_nlabel,
                       info->colors[iVar2 + local_88],info->units_label);
    }
    lVar4 = loc_sum((loc_conflict)((ulong)lVar4 & 0xffffffff | uVar6 << 0x20),
                    (loc_conflict)details->position_step);
    uVar6 = (ulong)lVar4 >> 0x20;
    local_88 = local_88 ^ 7;
    uVar5 = local_58 + 1;
  } while( true );
}

Assistant:

static void renderer_NUMERIC_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	int nbuf = info->ndigit + ((info->sign == UI_ENTRY_NO_SIGN) ? 0 : 1);
	wchar_t *buffer = mem_alloc(nbuf * sizeof(*buffer));
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 14 && info->nlabcolors >= 6 && info->nsym >= 7);

	for (i = 0; i < n; ++i) {
		int palette_index;

		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE || (vals[i] == 0 &&
			auxvals[i] == UI_ENTRY_UNKNOWN_VALUE)) {
			palette_index = 0;
			format_int(0, false, info->symbols[0],
				info->symbols[0], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (vals[i] == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
			format_int(0, false, info->symbols[1],
				info->symbols[1], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (vals[i] > 0) {
			palette_index = 3;
			format_int(vals[i], false, info->symbols[2],
				info->symbols[3], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN,
				nbuf, buffer);
		} else if (vals[i] < 0) {
			int v;
			bool o;

			palette_index = 4;
			if (vals[i] == INT_MIN) {
				v = -(INT_MIN + 1);
				o = true;
			} else {
				v = -vals[i];
				o = false;
			}
			format_int(v, o, info->symbols[2], info->symbols[4],
				false, info->sign != UI_ENTRY_NO_SIGN, nbuf,
				buffer);
		} else if (auxvals[i] > 0 &&
			auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 5;
			format_int(auxvals[i], false, info->symbols[2],
				info->symbols[5], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN, nbuf,
				buffer);
		} else if (auxvals[i] < 0 &&
			auxvals[i] != UI_ENTRY_UNKNOWN_VALUE &&
			auxvals[i] != UI_ENTRY_VALUE_NOT_PRESENT) {
			int v;
			bool o;

			palette_index = 6;
			if (auxvals[i] == INT_MIN) {
				v = -(INT_MIN + 1);
				o = true;
			} else {
				v = -vals[i];
				o = false;
			}
			format_int(v, o, info->symbols[2], info->symbols[6],
				false, info->sign != UI_ENTRY_NO_SIGN, nbuf,
				buffer);
		} else {
			palette_index = 2;
			format_int(0, false, info->symbols[2],
				info->symbols[3], true,
				info->sign == UI_ENTRY_ALWAYS_SIGN,
				nbuf, buffer);
		}
		safe_queue_chars(p.x, p.y, nbuf,
			info->colors[palette_index + color_offset], buffer);
		if (info->units_nlabel != 0) {
			safe_queue_chars(p.x + nbuf, p.y, info->units_nlabel,
				info->colors[palette_index + color_offset],
				info->units_label);
		}
		p = loc_sum(p, details->position_step);
		color_offset ^= 7;
	}

	mem_free(buffer);

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}
	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index;

		if (! details->known_rune) {
			palette_index = 0;
		} else if (vc == 0 || vc == UI_ENTRY_UNKNOWN_VALUE ||
			vc == UI_ENTRY_VALUE_NOT_PRESENT) {
			if (ac == 0 || ac == UI_ENTRY_UNKNOWN_VALUE ||
				ac == UI_ENTRY_VALUE_NOT_PRESENT) {
				palette_index = 1;
			} else if (ac > 0) {
				palette_index = 4;
			} else {
				palette_index = 5;
			}
		} else if (vc > 0) {
			palette_index = 2;
		} else {
			palette_index = 3;
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}